

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool File::isExecutable(String *file)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [8];
  stat buf;
  String *file_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)file;
  __file = String::operator_cast_to_char_(file);
  iVar1 = stat(__file,(stat *)local_a8);
  file_local._7_1_ = iVar1 == 0 && ((uint)buf.st_nlink & 0x49) != 0;
  return file_local._7_1_;
}

Assistant:

bool File::isExecutable(const String& file)
{
#ifdef _WIN32
  String extension = File::getExtension(file).toLowerCase();
  return extension == "exe" || extension == "com" || extension == "bat";
#else
  struct stat buf;
  if(stat(file, &buf) != 0)
    return false;
  return (buf.st_mode & (S_IXUSR | S_IXGRP | S_IXOTH)) != 0;
#endif
}